

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

int SUNNonlinSolGetNumConvFails_FixedPoint(SUNNonlinearSolver NLS,long *nconvfails)

{
  long *nconvfails_local;
  SUNNonlinearSolver NLS_local;
  int local_4;
  
  if (NLS == (SUNNonlinearSolver)0x0) {
    local_4 = -0x385;
  }
  else {
    *nconvfails = *(long *)((long)NLS->content + 0xa0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SUNNonlinSolGetNumConvFails_FixedPoint(SUNNonlinearSolver NLS, long int *nconvfails)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL)
    return(SUN_NLS_MEM_NULL);

  /* return the total number of nonlinear convergence failures */
  *nconvfails = FP_CONTENT(NLS)->nconvfails;
  return(SUN_NLS_SUCCESS);
}